

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode64Bit
          (UntypedMessage *this,CodedInputStream *stream,Field *field)

{
  bool bVar1;
  Field_Kind FVar2;
  Field *pFVar3;
  Field *in_RCX;
  int32_t local_f0;
  Field_Kind local_ec;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
  local_e8;
  string local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  byte local_99;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  uint64_t local_88;
  uint64_t x_2;
  byte local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  uint64_t local_60;
  uint64_t x_1;
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  uint64_t local_30;
  uint64_t x;
  Field *field_local;
  CodedInputStream *stream_local;
  UntypedMessage *this_local;
  Status *_status;
  
  x = (uint64_t)in_RCX;
  field_local = field;
  stream_local = stream;
  this_local = this;
  pFVar3 = ResolverPool::Field::proto(in_RCX);
  FVar2 = Field::kind(pFVar3);
  if (FVar2 == Field_Kind_TYPE_DOUBLE) {
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field_local,&local_88);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_98,"unexpected EOF");
      absl::lts_20240722::InvalidArgumentError(this,local_98._M_len,local_98._M_str);
      return (Status)(uintptr_t)this;
    }
    local_99 = 0;
    local_a8 = absl::lts_20240722::bit_cast<double,_unsigned_long,_0>(&local_88);
    InsertField<double>(this,(Field *)stream,(double *)x);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      local_99 = 1;
    }
    x_1._0_4_ = (uint)bVar1;
    if ((local_99 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
  }
  else if (FVar2 == Field_Kind_TYPE_FIXED64) {
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field_local,&local_30);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"unexpected EOF");
      absl::lts_20240722::InvalidArgumentError(this,local_40._M_len,local_40._M_str);
      return (Status)(uintptr_t)this;
    }
    local_41 = 0;
    InsertField<unsigned_long&>(this,(Field *)stream,(unsigned_long *)x);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      local_41 = 1;
    }
    x_1._0_4_ = (uint)bVar1;
    if ((local_41 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
  }
  else {
    if (FVar2 != Field_Kind_TYPE_SFIXED64) {
      absl::lts_20240722::str_format_internal::
      FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
      ::FormatSpecTemplate
                (&local_e8,"field type %d (number %d) does not support type 64-bit fields");
      pFVar3 = ResolverPool::Field::proto((Field *)x);
      local_ec = Field::kind(pFVar3);
      pFVar3 = ResolverPool::Field::proto((Field *)x);
      local_f0 = Field::number(pFVar3);
      absl::lts_20240722::StrFormat<google::protobuf::Field_Kind,_int>
                (&local_d8,&local_e8,&local_ec,&local_f0);
      local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d8);
      absl::lts_20240722::InvalidArgumentError(this,local_b8._0_8_,local_b8._8_8_);
      std::__cxx11::string::~string((string *)&local_d8);
      return (Status)(uintptr_t)this;
    }
    bVar1 = io::CodedInputStream::ReadLittleEndian64((CodedInputStream *)field_local,&local_60);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"unexpected EOF");
      absl::lts_20240722::InvalidArgumentError(this,local_70._M_len,local_70._M_str);
      return (Status)(uintptr_t)this;
    }
    local_71 = 0;
    x_2 = local_60;
    InsertField<long>(this,(Field *)stream,(long *)x);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      local_71 = 1;
    }
    x_1._0_4_ = (uint)bVar1;
    if ((local_71 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
  }
  if ((uint)x_1 == 0) {
    absl::lts_20240722::OkStatus();
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UntypedMessage::Decode64Bit(io::CodedInputStream& stream,
                                         const ResolverPool::Field& field) {
  switch (field.proto().kind()) {
    case Field::TYPE_FIXED64: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, x));
      break;
    }
    case Field::TYPE_SFIXED64: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, static_cast<int64_t>(x)));
      break;
    }
    case Field::TYPE_DOUBLE: {
      uint64_t x;
      if (!stream.ReadLittleEndian64(&x)) {
        return absl::InvalidArgumentError("unexpected EOF");
      }
      RETURN_IF_ERROR(InsertField(field, absl::bit_cast<double>(x)));
      break;
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrFormat("field type %d (number %d) does not support "
                          "type 64-bit fields",
                          field.proto().kind(), field.proto().number()));
  }
  return absl::OkStatus();
}